

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

uint * Kit_DsdTruthComputeTwo
                 (Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,uint uSupp,int iVar,uint *pTruthDec)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  void *pvVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int iVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  
  if (uSupp == 0) {
    __assert_fail("uSupp > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x405,
                  "unsigned int *Kit_DsdTruthComputeTwo(Kit_DsdMan_t *, Kit_DsdNtk_t *, unsigned int, int, unsigned int *)"
                 );
  }
  if ((int)(uint)pNtk->nVars <= p->nVars) {
    uVar10 = Kit_DsdGetSupports(pNtk);
    if ((uVar10 & uSupp) == 0) {
      uVar3 = pNtk->nVars;
      uVar10 = 1 << ((char)uVar3 - 5U & 0x1f);
      if ((ushort)uVar3 < 6) {
        uVar10 = 1;
      }
      if (0 < (int)uVar10) {
        memset(pTruthDec,0,(ulong)uVar10 << 2);
      }
      puVar11 = Kit_DsdTruthCompute(p,pNtk);
      return puVar11;
    }
    if ((uVar10 & uSupp) == uVar10) {
      puVar11 = Kit_DsdTruthCompute(p,pNtk);
      uVar2 = pNtk->nVars;
      uVar10 = 1 << ((char)uVar2 - 5U & 0x1f);
      if ((ushort)uVar2 < 6) {
        uVar10 = 1;
      }
      if (0 < (int)uVar10) {
        uVar15 = (ulong)uVar10;
        uVar12 = uVar15 + 1;
        do {
          pTruthDec[uVar12 - 2] = puVar11[uVar12 - 2];
          auVar9 = _DAT_008403e0;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
        if (iVar < 5) {
          uVar5 = (&DAT_0094de40)[iVar];
          lVar14 = uVar15 - 1;
          auVar16._8_4_ = (int)lVar14;
          auVar16._0_8_ = lVar14;
          auVar16._12_4_ = (int)((ulong)lVar14 >> 0x20);
          lVar14 = 0;
          auVar16 = auVar16 ^ _DAT_008403e0;
          auVar21 = _DAT_008403c0;
          auVar20 = _DAT_008403d0;
          do {
            auVar22 = auVar20 ^ auVar9;
            iVar18 = auVar16._4_4_;
            if ((bool)(~(auVar22._4_4_ == iVar18 && auVar16._0_4_ < auVar22._0_4_ ||
                        iVar18 < auVar22._4_4_) & 1)) {
              *(undefined4 *)((long)puVar11 + lVar14) = uVar5;
            }
            if ((auVar22._12_4_ != auVar16._12_4_ || auVar22._8_4_ <= auVar16._8_4_) &&
                auVar22._12_4_ <= auVar16._12_4_) {
              *(undefined4 *)((long)puVar11 + lVar14 + 4) = uVar5;
            }
            iVar23 = SUB164(auVar21 ^ auVar9,4);
            if (iVar23 <= iVar18 &&
                (iVar23 != iVar18 || SUB164(auVar21 ^ auVar9,0) <= auVar16._0_4_)) {
              *(undefined4 *)((long)puVar11 + lVar14 + 8) = uVar5;
              *(undefined4 *)((long)puVar11 + lVar14 + 0xc) = uVar5;
            }
            lVar19 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 4;
            auVar20._8_8_ = lVar19 + 4;
            lVar19 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 4;
            auVar21._8_8_ = lVar19 + 4;
            lVar14 = lVar14 + 0x10;
          } while ((ulong)(uVar10 + 3 >> 2) << 4 != lVar14);
        }
        else {
          uVar13 = 1 << ((char)iVar - 5U & 0x1f);
          lVar14 = uVar15 - 1;
          auVar17._8_4_ = (int)lVar14;
          auVar17._0_8_ = lVar14;
          auVar17._12_4_ = (int)((ulong)lVar14 >> 0x20);
          uVar12 = 0;
          auVar17 = auVar17 ^ _DAT_008403e0;
          auVar22 = _DAT_008403d0;
          do {
            auVar21 = auVar22 ^ auVar9;
            if ((bool)(~(auVar21._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar21._0_4_ ||
                        auVar17._4_4_ < auVar21._4_4_) & 1)) {
              puVar11[uVar12] = -(uint)((uVar13 & (uint)uVar12) != 0);
            }
            if ((auVar21._12_4_ != auVar17._12_4_ || auVar21._8_4_ <= auVar17._8_4_) &&
                auVar21._12_4_ <= auVar17._12_4_) {
              puVar11[uVar12 + 1] = -(uint)(((uint)uVar12 + 1 & uVar13) != 0);
            }
            uVar12 = uVar12 + 2;
            lVar14 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 2;
            auVar22._8_8_ = lVar14 + 2;
          } while ((uVar10 + 1 & 0xfffffffe) != uVar12);
        }
      }
    }
    else {
      uVar1 = pNtk->nVars;
      if ((ulong)uVar1 != 0) {
        pVVar6 = p->vTtNodes;
        uVar12 = 0;
        do {
          if (((long)pVVar6->nSize <= (long)uVar12) || ((long)p->vTtElems->nSize <= (long)uVar12)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar10 = 1 << ((char)p->nVars - 5U & 0x1f);
          if (p->nVars < 6) {
            uVar10 = 1;
          }
          if (0 < (int)uVar10) {
            pvVar7 = pVVar6->pArray[uVar12];
            pvVar8 = p->vTtElems->pArray[uVar12];
            uVar15 = (ulong)uVar10 + 1;
            do {
              *(undefined4 *)((long)pvVar7 + uVar15 * 4 + -8) =
                   *(undefined4 *)((long)pvVar8 + uVar15 * 4 + -8);
              uVar15 = uVar15 - 1;
            } while (1 < uVar15);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar1);
      }
      puVar11 = Kit_DsdTruthComputeNodeTwo_rec(p,pNtk,(uint)(pNtk->Root >> 1),uSupp,iVar,pTruthDec);
      if ((pNtk->Root & 1) != 0) {
        uVar4 = pNtk->nVars;
        uVar10 = 1 << ((char)uVar4 - 5U & 0x1f);
        if ((ushort)uVar4 < 6) {
          uVar10 = 1;
        }
        if (0 < (int)uVar10) {
          uVar12 = (ulong)uVar10 + 1;
          do {
            puVar11[uVar12 - 2] = ~puVar11[uVar12 - 2];
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
        }
      }
    }
    return puVar11;
  }
  __assert_fail("pNtk->nVars <= p->nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                ,0x406,
                "unsigned int *Kit_DsdTruthComputeTwo(Kit_DsdMan_t *, Kit_DsdNtk_t *, unsigned int, int, unsigned int *)"
               );
}

Assistant:

unsigned * Kit_DsdTruthComputeTwo( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, unsigned uSupp, int iVar, unsigned * pTruthDec )
{
    unsigned * pTruthRes, uSuppAll;
    int i;
    assert( uSupp > 0 );
    assert( pNtk->nVars <= p->nVars );
    // compute support of all nodes
    uSuppAll = Kit_DsdGetSupports( pNtk );
    // consider special case - there is no overlap
    if ( (uSupp & uSuppAll) == 0 )
    {
        Kit_TruthClear( pTruthDec, pNtk->nVars );
        return Kit_DsdTruthCompute( p, pNtk );
    }
    // consider special case - support is fully contained
    if ( (uSupp & uSuppAll) == uSuppAll )
    {
        pTruthRes = Kit_DsdTruthCompute( p, pNtk );
        Kit_TruthCopy( pTruthDec, pTruthRes, pNtk->nVars );
        Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
        return pTruthRes;
    }
    // assign elementary truth tables
    for ( i = 0; i < (int)pNtk->nVars; i++ )
        Kit_TruthCopy( (unsigned *)Vec_PtrEntry(p->vTtNodes, i), (unsigned *)Vec_PtrEntry(p->vTtElems, i), p->nVars );
    // compute truth table for each node
    pTruthRes = Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Abc_Lit2Var(pNtk->Root), uSupp, iVar, pTruthDec );
    // complement the truth table if needed
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
    return pTruthRes;
}